

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void __thiscall
dgrminer::PartialUnion::removeInfrequentEdges
          (PartialUnion *this,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges,
          set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
          *edges_set,int support_as_absolute,bool set_of_graphs,bool debugPrint)

{
  pointer paVar1;
  array<int,_8UL> *paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer paVar7;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __first;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  _Var8;
  pointer paVar9;
  const_iterator __first_00;
  long lVar10;
  long lVar11;
  array<int,_8UL> *paVar12;
  int count;
  undefined1 local_1b8 [24];
  _Base_ptr p_Stack_1a0;
  _Base_ptr local_198;
  int *local_190;
  bool bStack_188;
  undefined7 uStack_187;
  PartialUnion *local_180;
  int local_174;
  anon_class_64_6_c25d18ae_for__M_pred local_170;
  undefined1 local_130 [24];
  _Base_ptr p_Stack_118;
  _Base_ptr local_110;
  int *local_108;
  bool bStack_100;
  undefined7 uStack_ff;
  PartialUnion *local_f8;
  anon_class_64_6_c25d18ae_for__M_pred local_f0;
  anon_class_64_6_c25d18ae_for__M_pred local_b0;
  anon_class_64_4_590a51ff_for__M_pred local_70;
  
  local_174 = 0;
  paVar7 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar1 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_b0.edges_set = edges_set;
  local_b0.support_as_absolute = support_as_absolute;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_b0.newedges,newedges);
  local_b0.count = &local_174;
  local_b0.set_of_graphs = set_of_graphs;
  local_b0.this = this;
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_0::__0((__0 *)local_130,&local_b0);
  local_170.newedges.
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_110;
  local_170.newedges.
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)p_Stack_118;
  local_170.newedges.
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_130._16_8_;
  local_1b8._8_4_ = local_130._8_4_;
  local_1b8._0_8_ = local_130._0_8_;
  local_130._16_8_ = (_Base_ptr)0x0;
  p_Stack_118 = (_Base_ptr)0x0;
  local_110 = (_Base_ptr)0x0;
  local_190 = local_108;
  bStack_188 = bStack_100;
  uStack_187 = uStack_ff;
  local_180 = local_f8;
  local_170.edges_set =
       (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
        *)local_130._0_8_;
  local_170.support_as_absolute = local_130._8_4_;
  local_1b8._16_8_ = (_Base_ptr)0x0;
  p_Stack_1a0 = (_Base_ptr)0x0;
  local_198 = (_Base_ptr)0x0;
  local_170.this = local_f8;
  local_170.count = local_108;
  local_170.set_of_graphs = bStack_100;
  local_170._49_7_ = uStack_ff;
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_1b8 + 0x10));
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_0::__0((__0 *)&local_f0,&local_170);
  _Var8._M_current = (array<int,_8UL> *)&local_f0;
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_0::__0((__0 *)local_1b8,(anon_class_64_6_c25d18ae_for__M_pred *)_Var8._M_current);
  lVar11 = (long)paVar1 - (long)paVar7;
  for (lVar10 = lVar11 >> 7; 0 < lVar10; lVar10 = lVar10 + -1) {
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1b8,_Var8);
    __first_00._M_current = paVar7;
    if (bVar6) goto LAB_0012330a;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1b8,_Var8);
    if (bVar6) {
      __first_00._M_current = paVar7 + 1;
      goto LAB_0012330a;
    }
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1b8,_Var8);
    if (bVar6) {
      __first_00._M_current = paVar7 + 2;
      goto LAB_0012330a;
    }
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1b8,_Var8);
    if (bVar6) {
      __first_00._M_current = paVar7 + 3;
      goto LAB_0012330a;
    }
    paVar7 = paVar7 + 4;
    lVar11 = lVar11 + -0x80;
  }
  lVar11 = lVar11 >> 5;
  if (lVar11 == 1) {
LAB_001232e5:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1b8,_Var8);
    __first_00._M_current = paVar7;
    if (!bVar6) {
      __first_00._M_current = paVar1;
    }
  }
  else if (lVar11 == 2) {
LAB_001232d3:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1b8,_Var8);
    __first_00._M_current = paVar7;
    if (!bVar6) {
      paVar7 = paVar7 + 1;
      goto LAB_001232e5;
    }
  }
  else {
    __first_00._M_current = paVar1;
    if ((lVar11 == 3) &&
       (bVar6 = __gnu_cxx::__ops::
                _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
                ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                              *)local_1b8,_Var8), __first_00._M_current = paVar7, !bVar6)) {
      paVar7 = paVar7 + 1;
      goto LAB_001232d3;
    }
  }
LAB_0012330a:
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_1b8 + 0x10));
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            (&local_f0.newedges.
              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
  if (__first_00._M_current != paVar1) {
    paVar7 = __first_00._M_current;
    while (paVar9 = paVar7, paVar7 = paVar9 + 1, paVar7 != paVar1) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)&local_170,_Var8);
      if (!bVar6) {
        uVar3 = *(undefined8 *)paVar7->_M_elems;
        uVar4 = *(undefined8 *)(paVar9[1]._M_elems + 2);
        uVar5 = *(undefined8 *)(paVar9[1]._M_elems + 6);
        *(undefined8 *)((__first_00._M_current)->_M_elems + 4) =
             *(undefined8 *)(paVar9[1]._M_elems + 4);
        *(undefined8 *)((__first_00._M_current)->_M_elems + 6) = uVar5;
        *(undefined8 *)(__first_00._M_current)->_M_elems = uVar3;
        *(undefined8 *)((__first_00._M_current)->_M_elems + 2) = uVar4;
        __first_00._M_current = __first_00._M_current + 1;
      }
    }
  }
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            (&local_170.newedges.
              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_130 + 0x10));
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::erase
            (&this->edges,__first_00,
             (this->edges).
             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            (&local_b0.newedges.
              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
  _Var8._M_current =
       (newedges->super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (newedges->
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)&local_70,&edges_set->_M_t);
  local_70.support_as_absolute = support_as_absolute;
  local_70.set_of_graphs = set_of_graphs;
  local_70.this = this;
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_1::__1((__1 *)local_130,&local_70);
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_1::__1((__1 *)local_1b8,(anon_class_64_4_590a51ff_for__M_pred *)local_130);
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_1::__1((__1 *)&local_170,(anon_class_64_4_590a51ff_for__M_pred *)local_1b8);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_1b8);
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_1::__1((__1 *)&local_f0,(anon_class_64_4_590a51ff_for__M_pred *)&local_170);
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_1::__1((__1 *)local_1b8,(anon_class_64_4_590a51ff_for__M_pred *)&local_f0);
  lVar10 = (long)paVar2 - (long)_Var8._M_current;
  for (lVar11 = lVar10 >> 7; 0 < lVar11; lVar11 = lVar11 + -1) {
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                          *)local_1b8,_Var8);
    __first._M_current = _Var8._M_current;
    if (bVar6) goto LAB_001234f3;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                          *)local_1b8,_Var8._M_current + 1);
    __first._M_current = _Var8._M_current + 1;
    if (bVar6) goto LAB_001234f3;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                          *)local_1b8,_Var8._M_current + 2);
    __first._M_current = _Var8._M_current + 2;
    if (bVar6) goto LAB_001234f3;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                          *)local_1b8,_Var8._M_current + 3);
    __first._M_current = _Var8._M_current + 3;
    if (bVar6) goto LAB_001234f3;
    _Var8._M_current = _Var8._M_current + 4;
    lVar10 = lVar10 + -0x80;
  }
  lVar10 = lVar10 >> 5;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      __first._M_current = paVar2;
      if ((lVar10 != 3) ||
         (bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
                  ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                                *)local_1b8,_Var8), __first._M_current = _Var8._M_current, bVar6))
      goto LAB_001234f3;
      _Var8._M_current = _Var8._M_current + 1;
    }
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                          *)local_1b8,_Var8);
    __first._M_current = _Var8._M_current;
    if (bVar6) goto LAB_001234f3;
    _Var8._M_current = _Var8._M_current + 1;
  }
  bVar6 = __gnu_cxx::__ops::
          _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
          ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                        *)local_1b8,_Var8);
  __first._M_current = _Var8._M_current;
  if (!bVar6) {
    __first._M_current = paVar2;
  }
LAB_001234f3:
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_1b8);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)&local_f0);
  if (__first._M_current != paVar2) {
    _Var8._M_current = __first._M_current;
    while (paVar12 = _Var8._M_current, _Var8._M_current = paVar12 + 1, _Var8._M_current != paVar2) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)&local_170,_Var8);
      if (!bVar6) {
        uVar3 = *(undefined8 *)(_Var8._M_current)->_M_elems;
        uVar4 = *(undefined8 *)(paVar12[1]._M_elems + 2);
        uVar5 = *(undefined8 *)(paVar12[1]._M_elems + 6);
        *(undefined8 *)((__first._M_current)->_M_elems + 4) =
             *(undefined8 *)(paVar12[1]._M_elems + 4);
        *(undefined8 *)((__first._M_current)->_M_elems + 6) = uVar5;
        *(undefined8 *)(__first._M_current)->_M_elems = uVar3;
        *(undefined8 *)((__first._M_current)->_M_elems + 2) = uVar4;
        __first._M_current = __first._M_current + 1;
      }
    }
  }
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)&local_170);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_130);
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::erase
            (newedges,(const_iterator)__first._M_current,
             (newedges->
             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)&local_70);
  return;
}

Assistant:

void PartialUnion::removeInfrequentEdges(std::vector<std::array<int, 8>> & newedges, std::set<labeled_edge_with_occurrences> & edges_set,
		int support_as_absolute, bool set_of_graphs, bool debugPrint = false)
	{
		int count = 0;
		edges.erase(std::remove_if(std::begin(edges), std::end(edges), [&edges_set, support_as_absolute, newedges, &count, set_of_graphs, this](array<int, 8> edge) mutable {
			std::array<int, 8> ne = newedges[count];
			labeled_edge_with_occurrences le;
			le.elements = smallerDirectionOfAdjacencyInfo(ne);
			++count;

		  	std::set<labeled_edge_with_occurrences>::iterator it = edges_set.find(le);

			if (set_of_graphs)
			{
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = it->occurrences.begin(); it2 != it->occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(queryMappingSnapshotsToGraphs(*it2));
				}

				return (((!new_measures && mapped_occurrences.size() < support_as_absolute) || (new_measures && it->support(edges, true, heuristic_mis) < support_as_absolute))
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}
			else
			{
				// only change edges can be infrequent (i.e. any of their changetimes >= 0)
				return (it->support(edges, new_measures, heuristic_mis) < support_as_absolute
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}

		}), std::end(edges));


		newedges.erase(std::remove_if(std::begin(newedges), std::end(newedges), [edges_set, support_as_absolute, set_of_graphs, this](array<int, 8> edge) {
			labeled_edge_with_occurrences le;
			le.elements = smallerDirectionOfAdjacencyInfo(edge);

			auto it = edges_set.find(le);

			if (set_of_graphs)
			{
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = it->occurrences.begin(); it2 != it->occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(queryMappingSnapshotsToGraphs(*it2));
				}
				return (((!new_measures && mapped_occurrences.size() < support_as_absolute) || (new_measures && it->support(edges, true, heuristic_mis) < support_as_absolute))
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}
			else
			{
				return (it->support(edges, new_measures, heuristic_mis) < support_as_absolute
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}

		}), std::end(newedges));
	}